

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_features.c
# Opt level: O1

int mbedtls_version_check_feature(char *feature)

{
  int iVar1;
  char *__s1;
  char **ppcVar2;
  
  if (feature != (char *)0x0) {
    __s1 = "MBEDTLS_HAVE_ASM";
    ppcVar2 = features;
    do {
      ppcVar2 = ppcVar2 + 1;
      iVar1 = strcmp(__s1,feature);
      if (iVar1 == 0) {
        return 0;
      }
      __s1 = *ppcVar2;
    } while (__s1 != (char *)0x0);
  }
  return -1;
}

Assistant:

int mbedtls_version_check_feature( const char *feature )
{
    const char * const *idx = features;

    if( *idx == NULL )
        return( -2 );

    if( feature == NULL )
        return( -1 );

    while( *idx != NULL )
    {
        if( !strcmp( *idx, feature ) )
            return( 0 );
        idx++;
    }
    return( -1 );
}